

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

Transaction * __thiscall
cfd::core::Transaction::operator=(Transaction *this,Transaction *transaction)

{
  string local_38;
  Transaction *local_18;
  Transaction *transaction_local;
  Transaction *this_local;
  
  if (this != transaction) {
    local_18 = transaction;
    transaction_local = this;
    AbstractTransaction::GetHex_abi_cxx11_(&local_38,&transaction->super_AbstractTransaction);
    SetFromHex(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

Transaction &Transaction::operator=(const Transaction &transaction) & {
  if (this != &transaction) {
    SetFromHex(transaction.GetHex());
  }
  return *this;
}